

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O1

Var Js::TypedArray<double,_false,_false>::NewInstance
              (RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  ThreadContext *pTVar2;
  code *pcVar3;
  bool bVar4;
  bool bVar5;
  BOOL BVar6;
  undefined4 *puVar7;
  Var instance;
  Var pvVar8;
  RecyclableObject *pRVar9;
  RecyclableObject *constructor;
  int in_stack_00000010;
  Arguments local_60;
  ScriptContext *local_50;
  undefined1 auStack_48 [8];
  ArgumentReader args;
  CallInfo callInfo_local;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  args.super_Arguments.Values = (Type)callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != (int)args.super_Arguments.Values) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                ,0x1aa,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar4) goto LAB_00d8288d;
    *puVar7 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  auStack_48 = (undefined1  [8])args.super_Arguments.Values;
  ArgumentReader::AdjustArguments
            ((ArgumentReader *)auStack_48,(CallInfo *)&args.super_Arguments.Values);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)auStack_48 & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                ,0x1ad,"(args.Info.Count > 0)",
                                "Should always have implicit \'this\'");
    if (!bVar4) goto LAB_00d8288d;
    *puVar7 = 0;
  }
  instance = CallInfo::GetNewTarget
                       ((uint)auStack_48._0_4_ >> 0x18,(Var *)args.super_Arguments.Info,
                        auStack_48._0_4_ & 0xffffff);
  local_60.Info = (Type)auStack_48;
  local_60.Values = (Type)args.super_Arguments.Info;
  bVar4 = JavascriptOperators::IsConstructorSuperCall(&local_60);
  if ((!bVar4) && (((ulong)args.super_Arguments.Values & 0x1000000) != 0)) {
    pvVar8 = Arguments::operator[]((Arguments *)auStack_48,0);
    if (pvVar8 != (Var)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                  ,0x1b1,
                                  "(isCtorSuperCall || !(callInfo.Flags & CallFlags_New) || args[0] == nullptr)"
                                  ,
                                  "isCtorSuperCall || !(callInfo.Flags & CallFlags_New) || args[0] == nullptr"
                                 );
      if (!bVar5) {
LAB_00d8288d:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar7 = 0;
    }
  }
  if (((ulong)args.super_Arguments.Values & 0x1000000) != 0) {
    if (instance != (Var)0x0) {
      BVar6 = JavascriptOperators::IsUndefinedObject(instance);
      if (BVar6 != 0) goto LAB_00d82879;
    }
    pTVar2 = pSVar1->threadContext;
    bVar5 = pTVar2->reentrancySafeOrHandled;
    pTVar2->reentrancySafeOrHandled = true;
    local_50 = pSVar1;
    pRVar9 = (RecyclableObject *)
             TypedArrayBase::CreateNewInstance((Arguments *)auStack_48,pSVar1,8,Create);
    pTVar2->reentrancySafeOrHandled = bVar5;
    bVar5 = ConfigFlagsTable::IsEnabled((ConfigFlagsTable *)&Configuration::Global,autoProxyFlag);
    if (bVar5) {
      pRVar9 = JavascriptProxy::AutoProxyWrapper(pRVar9);
    }
    if (bVar4) {
      constructor = VarTo<Js::RecyclableObject>(instance);
      pRVar9 = VarTo<Js::RecyclableObject>(pRVar9);
      pRVar9 = JavascriptOperators::OrdinaryCreateFromConstructor
                         (constructor,pRVar9,(DynamicObject *)0x0,local_50);
    }
    return pRVar9;
  }
LAB_00d82879:
  JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ea00,L"[TypedArray]");
}

Assistant:

Var TypedArray<TypeName, clamped, virtualAllocated>::NewInstance(RecyclableObject* function, CallInfo callInfo, ...)
    {
        function->GetScriptContext()->GetThreadContext()->ProbeStack(Js::Constants::MinStackDefault, function->GetScriptContext());

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        AssertMsg(args.Info.Count > 0, "Should always have implicit 'this'");

        Var newTarget = args.GetNewTarget();
        bool isCtorSuperCall = JavascriptOperators::IsConstructorSuperCall(args);
        Assert(isCtorSuperCall || !(callInfo.Flags & CallFlags_New) || args[0] == nullptr);

        if (!(callInfo.Flags & CallFlags_New) || (newTarget && JavascriptOperators::IsUndefinedObject(newTarget)))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_ClassConstructorCannotBeCalledWithoutNew, _u("[TypedArray]"));
        }

        Var object = nullptr;
        BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
        {
            object = TypedArray::CreateNewInstance(args, scriptContext, sizeof(TypeName), TypedArray<TypeName, clamped, virtualAllocated>::Create);
        }
        END_SAFE_REENTRANT_CALL

#if ENABLE_DEBUG_CONFIG_OPTIONS
        if (Js::Configuration::Global.flags.IsEnabled(Js::autoProxyFlag))
        {
            object = Js::JavascriptProxy::AutoProxyWrapper(object);
        }
#endif
        return isCtorSuperCall ?
            JavascriptOperators::OrdinaryCreateFromConstructor(VarTo<RecyclableObject>(newTarget), VarTo<RecyclableObject>(object), nullptr, scriptContext) :
            object;
    }